

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O1

void __thiscall PolyFit<double>::dataToEigen(PolyFit<double> *this)

{
  pointer pdVar1;
  double *pdVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar4 = (long)(int)((ulong)((long)(this->x->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->x->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (-1 < lVar4) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->xM,lVar4,lVar4,1);
    lVar4 = (long)(int)((ulong)((long)(this->y->super__Vector_base<double,_std::allocator<double>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->y->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (-1 < lVar4) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)&this->yM,lVar4,lVar4,1);
      pdVar1 = (this->x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (uint)((ulong)((long)(this->x->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
      if (0 < (int)uVar3) {
        pdVar2 = (this->xM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data;
        uVar5 = (this->xM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
        uVar6 = 0;
        if ((long)uVar5 < 1) {
          uVar5 = uVar6;
        }
        do {
          if (uVar5 == uVar6) goto LAB_0010c5b4;
          pdVar2[uVar6] = pdVar1[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar6);
      }
      pdVar1 = (this->y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (uint)((ulong)((long)(this->y->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
      if (0 < (int)uVar3) {
        pdVar2 = (this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data;
        uVar5 = (this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
        uVar6 = 0;
        if ((long)uVar5 < 1) {
          uVar5 = uVar6;
        }
        do {
          if (uVar5 == uVar6) {
LAB_0010c5b4:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar2[uVar6] = pdVar1[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar6);
      }
      return;
    }
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void dataToEigen(void)
    {
      xM.resize(static_cast<int>(x.size()),1);
      yM.resize(static_cast<int>(y.size()),1);

      for (int i=0;i<static_cast<int>(x.size()); ++i)
        xM(i,0) = x[i];

      for (int i=0;i<static_cast<int>(y.size()); ++i)
        yM(i,0) = y[i];
    }